

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O2

void __thiscall chrono::ChConstraintNgeneric::Update_auxiliary(ChConstraintNgeneric *this)

{
  double dVar1;
  ChVariables *pCVar2;
  int iVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  Scalar SVar8;
  long local_78;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_70;
  void *local_58;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_48 [24];
  
  lVar6 = 0;
  uVar7 = 0;
  while( true ) {
    ppCVar5 = (this->variables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar4 = (this->variables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)ppCVar5 - (long)ppCVar4 >> 3) <= uVar7) break;
    if (ppCVar4[uVar7]->disabled == false) {
      iVar3 = (*ppCVar4[uVar7]->_vptr_ChVariables[2])();
      if (iVar3 != 0) {
        pCVar2 = (this->variables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7];
        Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                  (local_48,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                            ((long)&(((this->Eq).
                                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data + lVar6),(type *)0x0);
        local_78 = (long)&(((this->Cq).
                            super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                          m_data + lVar6;
        Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
                  ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_70,
                   (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                   &local_78,(type *)0x0);
        (*pCVar2->_vptr_ChVariables[4])(pCVar2,local_48,&local_70);
        Eigen::internal::handmade_aligned_free(local_58);
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x10;
  }
  (this->super_ChConstraint).g_i = 0.0;
  lVar6 = 0;
  for (uVar7 = 0; uVar7 < (ulong)((long)ppCVar5 - (long)ppCVar4 >> 3); uVar7 = uVar7 + 1) {
    if (ppCVar4[uVar7]->disabled == false) {
      iVar3 = (*ppCVar4[uVar7]->_vptr_ChVariables[2])();
      if (0 < iVar3) {
        local_70 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)
                              ((long)&(((this->Cq).
                                        super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                      ).m_storage.m_data + lVar6),
                              (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              ((long)&(((this->Eq).
                                        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      ).m_storage.m_data + lVar6));
        SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                          ((dense_product_base *)&local_70);
        (this->super_ChConstraint).g_i = SVar8 + (this->super_ChConstraint).g_i;
      }
    }
    ppCVar4 = (this->variables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar5 = (this->variables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + 0x10;
  }
  dVar1 = (this->super_ChConstraint).cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraint).g_i = dVar1 + (this->super_ChConstraint).g_i;
  }
  return;
}

Assistant:

void ChConstraintNgeneric::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]

    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive())
            if (variables[i]->Get_ndof()) {
                variables[i]->Compute_invMb_v(Eq[i], Cq[i].transpose());
            }
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive() && variables[i]->Get_ndof() > 0) {
            g_i += Cq[i] * Eq[i];
        }
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i)
        g_i += cfm_i;
}